

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
               *condc,ItemNamer *vnam)

{
  char *__s;
  size_t sVar1;
  BasicWriter<char> *this;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  
  __s = ItemNamer::at(vnam,(long)(condc->
                                 super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                                 ).super_FunctionalConstraint.result_var_);
  sVar1 = strlen(__s);
  value.size_ = sVar1;
  value.data_ = __s;
  this = fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
  value_00.size_ = 9;
  value_00.data_ = "==1 <==> ";
  fmt::BasicWriter<char>::operator<<(this,value_00);
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,'(');
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::LinTerms,1>
            (wrt,&(condc->
                  super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                  ).
                  super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                  .args_,vnam);
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,')');
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt,
                    const ConditionalConstraint<Con>& condc,
                    ItemNamer& vnam) {
  wrt << vnam.at(condc.GetResultVar()) << "==1 <==> ";
  wrt << '(';
  WriteModelItem(wrt, condc.GetArguments(), vnam);
  wrt << ')';
}